

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O2

aiNodeAnim * CreateNodeAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  undefined8 *puVar1;
  Sampler *pSVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  aiNodeAnim *paVar7;
  aiVectorKey *paVar8;
  aiQuatKey *paVar9;
  float *pfVar10;
  long lVar11;
  aiQuatKey *paVar12;
  ulong uVar13;
  aiVector3D *values;
  float *times;
  ulong local_48;
  
  paVar7 = (aiNodeAnim *)operator_new(0x438);
  (paVar7->mNodeName).length = 0;
  (paVar7->mNodeName).data[0] = '\0';
  memset((paVar7->mNodeName).data + 1,0x1b,0x3ff);
  paVar7->mRotationKeys = (aiQuatKey *)0x0;
  paVar7->mNumScalingKeys = 0;
  *(undefined8 *)&paVar7->mNumPositionKeys = 0;
  *(undefined8 *)((long)&paVar7->mPositionKeys + 4) = 0;
  paVar7->mScalingKeys = (aiVectorKey *)0x0;
  paVar7->mPreState = aiAnimBehaviour_DEFAULT;
  paVar7->mPostState = aiAnimBehaviour_DEFAULT;
  GetNodeName_abi_cxx11_((string *)&times,node);
  if (local_48 < 0x400) {
    (paVar7->mNodeName).length = (ai_uint32)local_48;
    memcpy((paVar7->mNodeName).data,times,local_48);
    (paVar7->mNodeName).data[local_48] = '\0';
  }
  std::__cxx11::string::~string((string *)&times);
  pSVar2 = samplers->translation;
  if (pSVar2 == (Sampler *)0x0) {
    if ((node->translation).isPresent == true) {
      paVar7->mNumPositionKeys = 1;
      paVar8 = (aiVectorKey *)operator_new__(0x18);
      paVar7->mPositionKeys = paVar8;
      paVar8->mTime = 0.0;
      fVar4 = (node->translation).value[1];
      (paVar8->mValue).x = (node->translation).value[0];
      (paVar8->mValue).y = fVar4;
      (paVar8->mValue).z = (node->translation).value[2];
    }
  }
  else {
    times = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              (*(Accessor **)
                ((long)(((pSVar2->input).vector)->
                       super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + (ulong)(pSVar2->input).index * 8),
               &times);
    values = (aiVector3D *)0x0;
    glTF2::Accessor::ExtractData<aiVector3t<float>>
              ((((samplers->translation->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->translation->output).index],&values);
    uVar3 = *(ulong *)(*(long *)((long)(((samplers->translation->input).vector)->
                                       super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start +
                                (ulong)(samplers->translation->input).index * 8) + 0x70);
    uVar13 = uVar3 & 0xffffffff;
    paVar7->mNumPositionKeys = (uint)uVar3;
    paVar8 = (aiVectorKey *)operator_new__(uVar13 * 0x18);
    if (uVar13 != 0) {
      lVar11 = 0;
      do {
        *(undefined4 *)((long)&(paVar8->mValue).z + lVar11) = 0;
        puVar1 = (undefined8 *)((long)&paVar8->mTime + lVar11);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar11 = lVar11 + 0x18;
      } while (uVar13 * 0x18 - lVar11 != 0);
    }
    paVar7->mPositionKeys = paVar8;
    pfVar10 = times;
    for (lVar11 = 0; uVar13 * 6 - lVar11 != 0; lVar11 = lVar11 + 6) {
      *(double *)((long)&paVar8->mTime + lVar11 * 4) = (double)(*pfVar10 * 1000.0);
      *(undefined8 *)(&(paVar8->mValue).x + lVar11) = *(undefined8 *)((long)&values->x + lVar11 * 2)
      ;
      (&(paVar8->mValue).z)[lVar11] = *(float *)((long)&values->z + lVar11 * 2);
      pfVar10 = pfVar10 + 1;
    }
    if (times != (float *)0x0) {
      operator_delete__(times);
    }
    if (values != (aiVector3D *)0x0) {
      operator_delete__(values);
    }
  }
  pSVar2 = samplers->rotation;
  if (pSVar2 == (Sampler *)0x0) {
    if ((node->rotation).isPresent == true) {
      paVar7->mNumRotationKeys = 1;
      paVar9 = (aiQuatKey *)operator_new__(0x18);
      paVar9->mTime = 0.0;
      paVar7->mRotationKeys = paVar9;
      fVar4 = (node->rotation).value[0];
      fVar5 = (node->rotation).value[1];
      fVar6 = (node->rotation).value[2];
      (paVar9->mValue).w = (node->rotation).value[3];
      (paVar9->mValue).x = fVar4;
      (paVar9->mValue).y = fVar5;
      (paVar9->mValue).z = fVar6;
    }
  }
  else {
    times = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar2->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar2->input).index],&times);
    values = (aiVector3D *)0x0;
    glTF2::Accessor::ExtractData<aiQuaterniont<float>>
              ((((samplers->rotation->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->rotation->output).index],
               (aiQuaterniont<float> **)&values);
    uVar3 = (((samplers->rotation->input).vector)->
            super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
            super__Vector_impl_data._M_start[(samplers->rotation->input).index]->count;
    uVar13 = uVar3 & 0xffffffff;
    paVar7->mNumRotationKeys = (uint)uVar3;
    paVar9 = (aiQuatKey *)operator_new__(uVar13 * 0x18);
    if (uVar13 != 0) {
      paVar12 = paVar9;
      do {
        paVar12->mTime = 0.0;
        (paVar12->mValue).w = 1.0;
        (paVar12->mValue).x = 0.0;
        (paVar12->mValue).y = 0.0;
        (paVar12->mValue).z = 0.0;
        paVar12 = paVar12 + 1;
      } while (paVar12 != paVar9 + uVar13);
    }
    paVar7->mRotationKeys = paVar9;
    pfVar10 = &(paVar9->mValue).z;
    for (lVar11 = 0; uVar13 << 2 != lVar11; lVar11 = lVar11 + 4) {
      *(double *)(pfVar10 + -5) = (double)(*(float *)((long)times + lVar11) * 1000.0);
      pfVar10[-2] = (&values->x)[lVar11];
      pfVar10[-1] = (&values->y)[lVar11];
      *pfVar10 = (&values->z)[lVar11];
      ((aiQuaternion *)(pfVar10 + -3))->w = (&values[1].x)[lVar11];
      pfVar10 = pfVar10 + 6;
    }
    if (times != (float *)0x0) {
      operator_delete__(times);
    }
    if (values != (aiVector3D *)0x0) {
      operator_delete__(values);
    }
  }
  pSVar2 = samplers->scale;
  if (pSVar2 == (Sampler *)0x0) {
    if ((node->scale).isPresent == true) {
      paVar7->mNumScalingKeys = 1;
      paVar8 = (aiVectorKey *)operator_new__(0x18);
      paVar7->mScalingKeys = paVar8;
      paVar8->mTime = 0.0;
      fVar4 = (node->scale).value[1];
      (paVar8->mValue).x = (node->scale).value[0];
      (paVar8->mValue).y = fVar4;
      (paVar8->mValue).z = (node->scale).value[2];
    }
  }
  else {
    times = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar2->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar2->input).index],&times);
    values = (aiVector3D *)0x0;
    glTF2::Accessor::ExtractData<aiVector3t<float>>
              ((((samplers->scale->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->scale->output).index],&values);
    uVar3 = (((samplers->scale->input).vector)->
            super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
            super__Vector_impl_data._M_start[(samplers->scale->input).index]->count;
    uVar13 = uVar3 & 0xffffffff;
    paVar7->mNumScalingKeys = (uint)uVar3;
    paVar8 = (aiVectorKey *)operator_new__(uVar13 * 0x18);
    if (uVar13 != 0) {
      lVar11 = 0;
      do {
        *(undefined4 *)((long)&(paVar8->mValue).z + lVar11) = 0;
        puVar1 = (undefined8 *)((long)&paVar8->mTime + lVar11);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar11 = lVar11 + 0x18;
      } while (uVar13 * 0x18 - lVar11 != 0);
    }
    paVar7->mScalingKeys = paVar8;
    pfVar10 = times;
    for (lVar11 = 0; uVar13 * 6 - lVar11 != 0; lVar11 = lVar11 + 6) {
      *(double *)((long)&paVar8->mTime + lVar11 * 4) = (double)(*pfVar10 * 1000.0);
      *(undefined8 *)(&(paVar8->mValue).x + lVar11) = *(undefined8 *)((long)&values->x + lVar11 * 2)
      ;
      (&(paVar8->mValue).z)[lVar11] = *(float *)((long)&values->z + lVar11 * 2);
      pfVar10 = pfVar10 + 1;
    }
    if (times != (float *)0x0) {
      operator_delete__(times);
    }
    if (values != (aiVector3D *)0x0) {
      operator_delete__(values);
    }
  }
  return paVar7;
}

Assistant:

aiNodeAnim* CreateNodeAnim(glTF2::Asset& r, Node& node, AnimationSamplers& samplers)
{
    aiNodeAnim* anim = new aiNodeAnim();
    anim->mNodeName = GetNodeName(node);

    static const float kMillisecondsFromSeconds = 1000.f;

    if (samplers.translation) {
        float* times = nullptr;
        samplers.translation->input->ExtractData(times);
        aiVector3D* values = nullptr;
        samplers.translation->output->ExtractData(values);
        anim->mNumPositionKeys = static_cast<uint32_t>(samplers.translation->input->count);
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];
        for (unsigned int i = 0; i < anim->mNumPositionKeys; ++i) {
            anim->mPositionKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mPositionKeys[i].mValue = values[i];
        }
        delete[] times;
        delete[] values;
    } else if (node.translation.isPresent) {
        anim->mNumPositionKeys = 1;
        anim->mPositionKeys = new aiVectorKey[anim->mNumPositionKeys];
        anim->mPositionKeys->mTime = 0.f;
        anim->mPositionKeys->mValue.x = node.translation.value[0];
        anim->mPositionKeys->mValue.y = node.translation.value[1];
        anim->mPositionKeys->mValue.z = node.translation.value[2];
    }

    if (samplers.rotation) {
        float* times = nullptr;
        samplers.rotation->input->ExtractData(times);
        aiQuaternion* values = nullptr;
        samplers.rotation->output->ExtractData(values);
        anim->mNumRotationKeys = static_cast<uint32_t>(samplers.rotation->input->count);
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];
        for (unsigned int i = 0; i < anim->mNumRotationKeys; ++i) {
            anim->mRotationKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mRotationKeys[i].mValue.x = values[i].w;
            anim->mRotationKeys[i].mValue.y = values[i].x;
            anim->mRotationKeys[i].mValue.z = values[i].y;
            anim->mRotationKeys[i].mValue.w = values[i].z;
        }
        delete[] times;
        delete[] values;
    } else if (node.rotation.isPresent) {
        anim->mNumRotationKeys = 1;
        anim->mRotationKeys = new aiQuatKey[anim->mNumRotationKeys];
        anim->mRotationKeys->mTime = 0.f;
        anim->mRotationKeys->mValue.x = node.rotation.value[0];
        anim->mRotationKeys->mValue.y = node.rotation.value[1];
        anim->mRotationKeys->mValue.z = node.rotation.value[2];
        anim->mRotationKeys->mValue.w = node.rotation.value[3];
    }

    if (samplers.scale) {
        float* times = nullptr;
        samplers.scale->input->ExtractData(times);
        aiVector3D* values = nullptr;
        samplers.scale->output->ExtractData(values);
        anim->mNumScalingKeys = static_cast<uint32_t>(samplers.scale->input->count);
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys];
        for (unsigned int i = 0; i < anim->mNumScalingKeys; ++i) {
            anim->mScalingKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
            anim->mScalingKeys[i].mValue = values[i];
        }
        delete[] times;
        delete[] values;
    } else if (node.scale.isPresent) {
        anim->mNumScalingKeys = 1;
        anim->mScalingKeys = new aiVectorKey[anim->mNumScalingKeys];
        anim->mScalingKeys->mTime = 0.f;
        anim->mScalingKeys->mValue.x = node.scale.value[0];
        anim->mScalingKeys->mValue.y = node.scale.value[1];
        anim->mScalingKeys->mValue.z = node.scale.value[2];
    }

    return anim;
}